

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadObjectRec(BCReaderState *s)

{
  JSContext *ctx;
  bool bVar1;
  JSValue JVar2;
  JSValue JVar3;
  int iVar4;
  JSRefCountHeader *p;
  JSValueUnion JVar5;
  uintptr_t sp;
  int64_t iVar6;
  JSValue JVar7;
  JSValue JVar8;
  undefined8 local_40;
  JSFloat64Union u;
  JSValueUnion JStack_30;
  uint8_t tag;
  
  ctx = s->ctx;
  JStack_30.float64 = 0.0;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar4 = bc_get_u8(s,(uint8_t *)((long)&u + 7));
  if (iVar4 != 0) goto LAB_0012dbd2;
  switch(u.u64._7_1_) {
  case 1:
    JStack_30.ptr = (void *)((ulong)(uint)JStack_30._4_4_ << 0x20);
    JVar7.tag = 2;
    JVar7.u.ptr = JStack_30.ptr;
    break;
  case 2:
    JStack_30.ptr = (void *)((ulong)(uint)JStack_30._4_4_ << 0x20);
    JVar7.tag = 3;
    JVar7.u.ptr = JStack_30.ptr;
    break;
  case 3:
  case 4:
    JVar7.u._1_7_ = 0;
    JVar7.u.int32._0_1_ = u.u64._7_1_ != '\x03';
    JVar7.tag = 1;
    break;
  case 5:
    iVar4 = bc_get_sleb128(s,(int32_t *)&local_40);
    iVar6 = 3;
    if (iVar4 == 0) {
      JStack_30._4_4_ = 0;
      JStack_30.int32 = (uint)local_40;
      iVar6 = 0;
    }
    goto LAB_0012dcbc;
  case 6:
    iVar4 = bc_get_u64(s,&local_40);
    iVar6 = 3;
    if (iVar4 == 0) {
      JStack_30._4_4_ = local_40._4_4_;
      JStack_30.int32 = (uint)local_40;
      iVar6 = 7;
    }
LAB_0012dcbc:
    JVar3.tag = iVar6;
    JVar3.u.ptr = JStack_30.ptr;
    if (iVar4 == 0) {
      return JVar3;
    }
    goto LAB_0012dbd2;
  case 7:
    JVar5.ptr = JS_ReadString(s);
    if ((JSString *)JVar5.ptr != (JSString *)0x0) {
      JVar2.tag = -7;
      JVar2.u.ptr = JVar5.ptr;
      return JVar2;
    }
    goto LAB_0012dbd2;
  case 8:
    JVar7 = JS_ReadObjectTag(s);
    break;
  case 9:
  case 0xd:
    JVar7 = JS_ReadArray(s,(uint)(byte)u.u64._7_1_);
    break;
  default:
    goto switchD_0012dbf8_caseD_a;
  case 0xe:
    if (s->field_0x35 != '\0') {
      JVar8 = JS_ReadFunctionTag(s);
      return JVar8;
    }
    goto switchD_0012dbf8_caseD_a;
  case 0xf:
    if (s->field_0x35 != '\0') {
      JVar8 = JS_ReadModule(s);
      return JVar8;
    }
    goto switchD_0012dbf8_caseD_a;
  case 0x10:
    JVar7 = JS_ReadTypedArray(s);
    break;
  case 0x11:
    JVar7 = JS_ReadArrayBuffer(s);
    break;
  case 0x12:
    if ((s->field_0x34 != '\0') &&
       ((ctx->rt->sab_funcs).sab_dup != (_func_void_void_ptr_void_ptr *)0x0)) {
      JVar8 = JS_ReadSharedArrayBuffer(s);
      return JVar8;
    }
switchD_0012dbf8_caseD_a:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    JS_ThrowSyntaxError(ctx,"invalid tag (tag=%d pos=%u)",(ulong)(byte)u.u64._7_1_,
                        (ulong)(uint)(*(int *)&s->ptr - *(int *)&s->buf_start));
    break;
  case 0x13:
    JVar7 = JS_ReadDate(s);
    break;
  case 0x14:
    JVar7 = JS_ReadObjectValue(s);
    break;
  case 0x15:
    if (*(uint *)&s->field_0x34 < 0x1000000) {
      bVar1 = false;
      JS_ThrowSyntaxError(ctx,"object references are not allowed");
      iVar6 = 3;
    }
    else {
      iVar4 = bc_get_leb128(s,(uint32_t *)&local_40);
      iVar6 = 3;
      if (iVar4 == 0) {
        if ((uint)local_40 < (uint)s->objects_count) {
          JStack_30 = (JSValueUnion)((JSValueUnion *)(s->objects + (uint)local_40))->ptr;
          *(int *)JStack_30.ptr = *JStack_30.ptr + 1;
          iVar6 = -1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          JS_ThrowSyntaxError(ctx,"invalid object reference (%u >= %u)");
        }
      }
      else {
        bVar1 = false;
      }
    }
    JVar8.tag = iVar6;
    JVar8.u.float64 = JStack_30.float64;
    if (bVar1) {
      return JVar8;
    }
LAB_0012dbd2:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar7;
}

Assistant:

static JSValue JS_ReadObjectRec(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    uint8_t tag;
    JSValue obj = JS_UNDEFINED;

    if (js_check_stack_overflow(ctx->rt, 0))
        return JS_ThrowStackOverflow(ctx);

    if (bc_get_u8(s, &tag))
        return JS_EXCEPTION;

    bc_read_trace(s, "%s {\n", bc_tag_str[tag]);

    switch(tag) {
    case BC_TAG_NULL:
        obj = JS_NULL;
        break;
    case BC_TAG_UNDEFINED:
        obj = JS_UNDEFINED;
        break;
    case BC_TAG_BOOL_FALSE:
    case BC_TAG_BOOL_TRUE:
        obj = JS_NewBool(ctx, tag - BC_TAG_BOOL_FALSE);
        break;
    case BC_TAG_INT32:
        {
            int32_t val;
            if (bc_get_sleb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%d\n", val);
            obj = JS_NewInt32(ctx, val);
        }
        break;
    case BC_TAG_FLOAT64:
        {
            JSFloat64Union u;
            if (bc_get_u64(s, &u.u64))
                return JS_EXCEPTION;
            bc_read_trace(s, "%g\n", u.d);
            obj = __JS_NewFloat64(ctx, u.d);
        }
        break;
    case BC_TAG_STRING:
        {
            JSString *p;
            p = JS_ReadString(s);
            if (!p)
                return JS_EXCEPTION;
            obj = JS_MKPTR(JS_TAG_STRING, p);
        }
        break;
    case BC_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadFunctionTag(s);
        break;
    case BC_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadModule(s);
        break;
    case BC_TAG_OBJECT:
        obj = JS_ReadObjectTag(s);
        break;
    case BC_TAG_ARRAY:
    case BC_TAG_TEMPLATE_OBJECT:
        obj = JS_ReadArray(s, tag);
        break;
    case BC_TAG_TYPED_ARRAY:
        obj = JS_ReadTypedArray(s);
        break;
    case BC_TAG_ARRAY_BUFFER:
        obj = JS_ReadArrayBuffer(s);
        break;
    case BC_TAG_SHARED_ARRAY_BUFFER:
        if (!s->allow_sab || !ctx->rt->sab_funcs.sab_dup)
            goto invalid_tag;
        obj = JS_ReadSharedArrayBuffer(s);
        break;
    case BC_TAG_DATE:
        obj = JS_ReadDate(s);
        break;
    case BC_TAG_OBJECT_VALUE:
        obj = JS_ReadObjectValue(s);
        break;
#ifdef CONFIG_BIGNUM
    case BC_TAG_BIG_INT:
    case BC_TAG_BIG_FLOAT:
    case BC_TAG_BIG_DECIMAL:
        obj = JS_ReadBigNum(s, tag);
        break;
#endif
    case BC_TAG_OBJECT_REFERENCE:
        {
            uint32_t val;
            if (!s->allow_reference)
                return JS_ThrowSyntaxError(ctx, "object references are not allowed");
            if (bc_get_leb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%u\n", val);
            if (val >= s->objects_count) {
                return JS_ThrowSyntaxError(ctx, "invalid object reference (%u >= %u)",
                                           val, s->objects_count);
            }
            obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, s->objects[val]));
        }
        break;
    default:
    invalid_tag:
        return JS_ThrowSyntaxError(ctx, "invalid tag (tag=%d pos=%u)",
                                   tag, (unsigned int)(s->ptr - s->buf_start));
    }
    bc_read_trace(s, "}\n");
    return obj;
}